

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::CreateRel
          (Relation *this,string *schema_name,string *table_name,bool temporary,
          OnCreateConflict on_conflict)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  OnCreateConflict on_conflict_local;
  bool temporary_local;
  undefined1 local_69;
  shared_ptr<duckdb::CreateTableRelation,_true> local_68;
  enable_shared_from_this<duckdb::Relation> local_50;
  shared_ptr<duckdb::CreateTableRelation> local_40;
  
  temporary_local = (bool)on_conflict;
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_50);
  local_40.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CreateTableRelation,std::allocator<duckdb::CreateTableRelation>,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&,bool&,duckdb::OnCreateConflict&>
            (&local_40.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(CreateTableRelation **)&local_40,
             (allocator<duckdb::CreateTableRelation> *)&local_69,
             (shared_ptr<duckdb::Relation,_true> *)&local_50,table_name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000009,temporary),&temporary_local,&on_conflict_local);
  shared_ptr<duckdb::CreateTableRelation,_true>::shared_ptr(&local_68,&local_40);
  _Var2._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_68.internal.
                super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_68.internal.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_68.internal.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_68.internal.super___shared_ptr<duckdb::CreateTableRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  if (local_50.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::CreateRel(const string &schema_name, const string &table_name, bool temporary,
                                         OnCreateConflict on_conflict) {
	return make_shared_ptr<CreateTableRelation>(shared_from_this(), schema_name, table_name, temporary, on_conflict);
}